

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O0

MethodHandle * __thiscall
jsonrpccxx::GetHandle<float,float,float>
          (MethodHandle *__return_storage_ptr__,jsonrpccxx *this,_func_float_float_float *f)

{
  function<float_(float,_float)> *f_00;
  function<float_(float,_float)> local_38;
  jsonrpccxx *local_18;
  _func_float_float_float *f_local;
  
  local_18 = this;
  f_local = (_func_float_float_float *)__return_storage_ptr__;
  std::function<float(float,float)>::function<float(*&)(float,float),void>
            ((function<float(float,float)> *)&local_38,(_func_float_float_float **)&local_18);
  GetHandle<float,float,float>(__return_storage_ptr__,(jsonrpccxx *)&local_38,f_00);
  std::function<float_(float,_float)>::~function(&local_38);
  return __return_storage_ptr__;
}

Assistant:

MethodHandle GetHandle(ReturnType (*f)(ParamTypes...)) {
    return GetHandle(std::function<ReturnType(ParamTypes...)>(f));
  }